

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBAddRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar7 [16];
  
  auVar3 = _DAT_00432880;
  lVar4 = 0;
  if (width < 1) {
    width = 0;
  }
  for (; width != (int)lVar4; lVar4 = lVar4 + 1) {
    uVar1 = *(undefined4 *)(src_argb0 + lVar4 * 4);
    uVar2 = *(undefined4 *)(src_argb1 + lVar4 * 4);
    auVar7._0_2_ = ((ushort)uVar2 & 0xff) + ((ushort)uVar1 & 0xff);
    auVar7._2_2_ = (ushort)(byte)((uint)uVar2 >> 8) + (ushort)(byte)((uint)uVar1 >> 8);
    auVar7._4_2_ = (ushort)(byte)((uint)uVar2 >> 0x10) + (ushort)(byte)((uint)uVar1 >> 0x10);
    auVar7._6_2_ = (ushort)(byte)((uint)uVar2 >> 0x18) + (ushort)(byte)((uint)uVar1 >> 0x18);
    auVar7._8_8_ = 0;
    auVar5 = psubusw(auVar7,auVar3);
    sVar6 = auVar7._0_2_ - auVar5._0_2_;
    sVar8 = auVar7._2_2_ - auVar5._2_2_;
    sVar9 = auVar7._4_2_ - auVar5._4_2_;
    sVar10 = auVar7._6_2_ - auVar5._6_2_;
    *(uint *)(dst_argb + lVar4 * 4) =
         CONCAT13((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                  CONCAT12((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                           CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8),
                                    (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6))));
  }
  return;
}

Assistant:

void ARGBAddRow_C(const uint8_t* src_argb0,
                  const uint8_t* src_argb1,
                  uint8_t* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_add = src_argb1[0];
    const int g_add = src_argb1[1];
    const int r_add = src_argb1[2];
    const int a_add = src_argb1[3];
    dst_argb[0] = SHADE(b, b_add);
    dst_argb[1] = SHADE(g, g_add);
    dst_argb[2] = SHADE(r, r_add);
    dst_argb[3] = SHADE(a, a_add);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}